

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O1

void __thiscall LazyARAPlanner::~LazyARAPlanner(LazyARAPlanner *this)

{
  pointer pPVar1;
  pointer ppLVar2;
  
  (this->super_SBPLPlanner)._vptr_SBPLPlanner = (_func_int **)&PTR_replan_00158800;
  freeMemory(this);
  pPVar1 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1,(long)(this->stats).
                                 super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar1);
  }
  ppLVar2 = (this->states).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->states).
                                  super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2
                   );
  }
  ppLVar2 = (this->incons).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->incons).
                                  super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2
                   );
  }
  CHeap::~CHeap(&this->heap);
  return;
}

Assistant:

LazyARAPlanner::~LazyARAPlanner()
{
    freeMemory();
}